

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O1

wchar_t read_zip64_eocd(archive_read *a,zip *zip,char *p)

{
  int64_t iVar1;
  void *pvVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  wchar_t wVar5;
  
  wVar5 = L'\0';
  if ((*(int *)(p + 4) == 0) && (wVar5 = L'\0', *(int *)(p + 0x10) == 1)) {
    wVar5 = L'\0';
    iVar1 = __archive_read_seek(a,*(int64_t *)(p + 8),0);
    if (-1 < iVar1) {
      wVar5 = L'\0';
      pvVar2 = __archive_read_ahead(a,0x38,(ssize_t *)0x0);
      if ((pvVar2 != (void *)0x0) && (0xffffffffffffc036 < *(long *)((long)pvVar2 + 4) - 0x3ff5U)) {
        wVar5 = L'\0';
        pvVar2 = __archive_read_ahead(a,*(long *)((long)pvVar2 + 4) + 0xc,(ssize_t *)0x0);
        if ((pvVar2 != (void *)0x0) &&
           ((*(int *)((long)pvVar2 + 0x10) == 0 && (*(int *)((long)pvVar2 + 0x14) == 0)))) {
          uVar3 = archive_le64dec((void *)((long)pvVar2 + 0x18));
          uVar4 = archive_le64dec((void *)((long)pvVar2 + 0x20));
          if (uVar3 == uVar4) {
            uVar3 = archive_le64dec((void *)((long)pvVar2 + 0x30));
            zip->central_directory_offset = uVar3;
            wVar5 = L' ';
          }
        }
      }
    }
  }
  return wVar5;
}

Assistant:

static int
read_zip64_eocd(struct archive_read *a, struct zip *zip, const char *p)
{
	int64_t eocd64_offset;
	int64_t eocd64_size;

	/* Sanity-check the locator record. */

	/* Central dir must be on first volume. */
	if (archive_le32dec(p + 4) != 0)
		return 0;
	/* Must be only a single volume. */
	if (archive_le32dec(p + 16) != 1)
		return 0;

	/* Find the Zip64 EOCD record. */
	eocd64_offset = archive_le64dec(p + 8);
	if (__archive_read_seek(a, eocd64_offset, SEEK_SET) < 0)
		return 0;
	if ((p = __archive_read_ahead(a, 56, NULL)) == NULL)
		return 0;
	/* Make sure we can read all of it. */
	eocd64_size = archive_le64dec(p + 4) + 12;
	if (eocd64_size < 56 || eocd64_size > 16384)
		return 0;
	if ((p = __archive_read_ahead(a, (size_t)eocd64_size, NULL)) == NULL)
		return 0;

	/* Sanity-check the EOCD64 */
	if (archive_le32dec(p + 16) != 0) /* Must be disk #0 */
		return 0;
	if (archive_le32dec(p + 20) != 0) /* CD must be on disk #0 */
		return 0;
	/* CD can't be split. */
	if (archive_le64dec(p + 24) != archive_le64dec(p + 32))
		return 0;

	/* Save the central directory offset for later use. */
	zip->central_directory_offset = archive_le64dec(p + 48);

	return 32;
}